

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PDB_DBIStream.cpp
# Opt level: O0

GlobalSymbolStream * __thiscall
PDB::DBIStream::CreateGlobalSymbolStream
          (GlobalSymbolStream *__return_storage_ptr__,DBIStream *this,RawFile *file)

{
  HashTableHeader HVar1;
  uint32_t recordCount;
  HashTableHeader hashHeader;
  DirectMSFStream globalStream;
  RawFile *file_local;
  DBIStream *this_local;
  
  RawFile::CreateMSFStream<PDB::DirectMSFStream>
            ((DirectMSFStream *)&hashHeader.size,file,(uint)(this->m_header).globalStreamIndex);
  HVar1 = DirectMSFStream::ReadAtOffset<PDB::HashTableHeader>((DirectMSFStream *)&hashHeader.size,0)
  ;
  hashHeader.signature = HVar1.size;
  GlobalSymbolStream::GlobalSymbolStream
            (__return_storage_ptr__,file,(this->m_header).globalStreamIndex,
             hashHeader.signature >> 3);
  return __return_storage_ptr__;
}

Assistant:

PDB_NO_DISCARD PDB::GlobalSymbolStream PDB::DBIStream::CreateGlobalSymbolStream(const RawFile& file) const PDB_NO_EXCEPT
{
	DirectMSFStream globalStream = file.CreateMSFStream<DirectMSFStream>(m_header.globalStreamIndex);

	// the global symbol stream starts with a hash table header.
	// we use this to work out how many symbol records are referenced by the global symbol stream.
	const HashTableHeader hashHeader = globalStream.ReadAtOffset<HashTableHeader>(0u);
	const uint32_t recordCount = hashHeader.size / sizeof(HashRecord);

	return GlobalSymbolStream(file, m_header.globalStreamIndex, recordCount);
}